

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ecp.c
# Opt level: O2

void ecpTplJA3(word *b,word *a,ec_o *ec,void *stack)

{
  word *b_00;
  word *b_01;
  word *c;
  word *c_00;
  word *a_00;
  word *b_02;
  word *pwVar1;
  word *pwVar2;
  word *b_03;
  qr_o *pqVar3;
  size_t sVar4;
  word *c_01;
  
  pqVar3 = ec->f;
  sVar4 = pqVar3->n;
  b_00 = (word *)((long)stack + sVar4 * 8);
  b_01 = b_00 + sVar4;
  c = b_01 + sVar4;
  c_00 = c + sVar4;
  a_00 = c_00 + sVar4;
  b_02 = a_00 + sVar4;
  pwVar1 = b_02 + sVar4;
  pwVar2 = a + sVar4;
  (*pqVar3->sqr)((word *)stack,pwVar2,pqVar3,pwVar1);
  (*ec->f->sqr)(b_00,pwVar2 + sVar4,ec->f,pwVar1);
  (*ec->f->sqr)(b_01,(word *)stack,ec->f,pwVar1);
  zzSubMod(c,a,b_00,ec->f->mod,ec->f->n);
  zzAddMod(c_00,a,b_00,ec->f->mod,ec->f->n);
  (*ec->f->mul)(c,c,c_00,ec->f,pwVar1);
  zzDoubleMod(c_00,c,ec->f->mod,ec->f->n);
  zzAddMod(c,c,c_00,ec->f->mod,ec->f->n);
  (*ec->f->sqr)(c_00,c,ec->f,pwVar1);
  (*ec->f->mul)(a_00,a,(word *)stack,ec->f,pwVar1);
  zzDoubleMod(b_02,a_00,ec->f->mod,ec->f->n);
  zzAddMod(a_00,a_00,b_02,ec->f->mod,ec->f->n);
  zzDoubleMod(a_00,a_00,ec->f->mod,ec->f->n);
  zzDoubleMod(a_00,a_00,ec->f->mod,ec->f->n);
  zzSubMod(a_00,a_00,c_00,ec->f->mod,ec->f->n);
  (*ec->f->sqr)(b_02,a_00,ec->f,pwVar1);
  zzDoubleMod(b_01,b_01,ec->f->mod,ec->f->n);
  zzDoubleMod(b_01,b_01,ec->f->mod,ec->f->n);
  zzDoubleMod(b_01,b_01,ec->f->mod,ec->f->n);
  zzDoubleMod(b_01,b_01,ec->f->mod,ec->f->n);
  b_03 = b + sVar4;
  c_01 = b_03 + sVar4;
  zzAddMod(c_01,pwVar2 + sVar4,a_00,ec->f->mod,ec->f->n);
  (*ec->f->sqr)(c_01,c_01,ec->f,pwVar1);
  zzSubMod(c_01,c_01,b_00,ec->f->mod,ec->f->n);
  zzSubMod(c_01,c_01,b_02,ec->f->mod,ec->f->n);
  zzAddMod(b_00,c,a_00,ec->f->mod,ec->f->n);
  (*ec->f->sqr)(b_00,b_00,ec->f,pwVar1);
  zzSubMod(b_00,b_00,c_00,ec->f->mod,ec->f->n);
  zzSubMod(b_00,b_00,b_02,ec->f->mod,ec->f->n);
  zzSubMod(b_00,b_00,b_01,ec->f->mod,ec->f->n);
  zzSubMod(b_01,b_01,b_00,ec->f->mod,ec->f->n);
  (*ec->f->mul)(b_01,b_00,b_01,ec->f,pwVar1);
  (*ec->f->mul)(a_00,a_00,b_02,ec->f,pwVar1);
  zzSubMod(b_01,b_01,a_00,ec->f->mod,ec->f->n);
  (*ec->f->mul)(b_03,pwVar2,b_01,ec->f,pwVar1);
  zzDoubleMod(b_03,b_03,ec->f->mod,ec->f->n);
  zzDoubleMod(b_03,b_03,ec->f->mod,ec->f->n);
  zzDoubleMod(b_03,b_03,ec->f->mod,ec->f->n);
  (*ec->f->mul)((word *)stack,(word *)stack,b_00,ec->f,pwVar1);
  zzDoubleMod((word *)stack,(word *)stack,ec->f->mod,ec->f->n);
  zzDoubleMod((word *)stack,(word *)stack,ec->f->mod,ec->f->n);
  (*ec->f->mul)(b,a,b_02,ec->f,pwVar1);
  zzSubMod(b,b,(word *)stack,ec->f->mod,ec->f->n);
  zzDoubleMod(b,b,ec->f->mod,ec->f->n);
  zzDoubleMod(b,b,ec->f->mod,ec->f->n);
  return;
}

Assistant:

static void ecpTplJA3(word b[], const word a[], const ec_o* ec, void* stack)
{
	const size_t n = ec->f->n;
	// переменные в stack
	word* t1 = (word*)stack;
	word* t2 = t1 + n;
	word* t3 = t2 + n;
	word* t4 = t3 + n;
	word* t5 = t4 + n;
	word* t6 = t5 + n;
	word* t7 = t6 + n;
	stack = t7 + n;
	// pre
	ASSERT(ecIsOperable(ec) && ec->d == 3);
	ASSERT(ecpSeemsOn3(a, ec));
	ASSERT(wwIsSameOrDisjoint(a, b, 3 * n));
	// t1 <- ya^2 [YY]
	qrSqr(t1, ecY(a, n), ec->f, stack);
	// t2 <- za^2 [ZZ]
	qrSqr(t2, ecZ(a, n), ec->f, stack);
	// t3 <- t1^2 [YYYY]
	qrSqr(t3, t1, ec->f, stack);
	// t4 <- 3(xa - t2)(xa + t2) [M]
	zmSub(t4, ecX(a), t2, ec->f);
	zmAdd(t5, ecX(a), t2, ec->f);
	qrMul(t4, t4, t5, ec->f, stack);
	gfpDouble(t5, t4, ec->f);
	zmAdd(t4, t4, t5, ec->f);
	// t5 <- t4^2 [MM]
	qrSqr(t5, t4, ec->f, stack);
	// t6 <- 12 xa t1 - t5 [E]
	qrMul(t6, ecX(a), t1, ec->f, stack);
	gfpDouble(t7, t6, ec->f);
	zmAdd(t6, t6, t7, ec->f);
	gfpDouble(t6, t6, ec->f);
	gfpDouble(t6, t6, ec->f);
	zmSub(t6, t6, t5, ec->f);
	// t7 <- t6^2 [EE]
	qrSqr(t7, t6, ec->f, stack);
	// t3 <- 16 t3 [T]
	gfpDouble(t3, t3, ec->f);
	gfpDouble(t3, t3, ec->f);
	gfpDouble(t3, t3, ec->f);
	gfpDouble(t3, t3, ec->f);
	// zb <- (za + t6)^2 - t2 - t7
	zmAdd(ecZ(b, n), ecZ(a, n), t6, ec->f);
	qrSqr(ecZ(b, n), ecZ(b, n), ec->f, stack);
	zmSub(ecZ(b, n), ecZ(b, n), t2, ec->f);
	zmSub(ecZ(b, n), ecZ(b, n), t7, ec->f);
	// t2 <- (t4 + t6)^2 - t5 - t7 - t3 [U] 
	zmAdd(t2, t4, t6, ec->f);
	qrSqr(t2, t2, ec->f, stack);
	zmSub(t2, t2, t5, ec->f);
	zmSub(t2, t2, t7, ec->f);
	zmSub(t2, t2, t3, ec->f);
	// yb <- 8 ya (t2(t3 - t2) - t6 t7)
	zmSub(t3, t3, t2, ec->f);
	qrMul(t3, t2, t3, ec->f, stack);
	qrMul(t6, t6, t7, ec->f, stack);
	zmSub(t3, t3, t6, ec->f);
	qrMul(ecY(b, n), ecY(a, n), t3, ec->f, stack);
	gfpDouble(ecY(b, n), ecY(b, n), ec->f);
	gfpDouble(ecY(b, n), ecY(b, n), ec->f);
	gfpDouble(ecY(b, n), ecY(b, n), ec->f);
	// xb <- 4 (xa t7 - 4 t1 t2)
	qrMul(t1, t1, t2, ec->f, stack);
	gfpDouble(t1, t1, ec->f);
	gfpDouble(t1, t1, ec->f);
	qrMul(ecX(b), ecX(a), t7, ec->f, stack);
	zmSub(ecX(b), ecX(b), t1, ec->f);
	gfpDouble(ecX(b), ecX(b), ec->f);
	gfpDouble(ecX(b), ecX(b), ec->f);
}